

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void http_handler(mg_connection *nc,int ev,void *ev_data)

{
  uint is_req_00;
  int iVar1;
  int iVar2;
  mbuf *mb;
  mg_str *pmVar3;
  int trigger_ev;
  mg_str *s;
  int ev2;
  mg_str *vec;
  int is_req;
  int req_len;
  mbuf *io;
  http_message *hm;
  http_message shm;
  void *ev_data_local;
  int ev_local;
  mg_connection *nc_local;
  
  mb = &nc->recv_mbuf;
  is_req_00 = (uint)(nc->listener != (mg_connection *)0x0);
  shm.body.len = (size_t)ev_data;
  if (ev == 5) {
    if (((nc->recv_mbuf).len != 0) &&
       (iVar1 = mg_parse_http(mb->buf,(int)(nc->recv_mbuf).len,(http_message *)&hm,is_req_00),
       0 < iVar1)) {
      iVar1 = 0x65;
      if (is_req_00 != 0) {
        iVar1 = 100;
      }
      shm.message.p = (char *)(nc->recv_mbuf).len;
      shm.body.p = mb->buf + ((nc->recv_mbuf).len - shm.header_values[0x27].len);
      mg_call(nc,nc->handler,iVar1,(http_message *)&hm);
    }
    free_http_proto_data(nc);
  }
  if (nc->proto_data != (void *)0x0) {
    transfer_file_data(nc);
  }
  mg_call(nc,nc->handler,ev,(void *)shm.body.len);
  if (ev == 3) {
    iVar1 = mg_parse_http(mb->buf,(int)(nc->recv_mbuf).len,(http_message *)&hm,is_req_00);
    if (((0 < iVar1) &&
        (pmVar3 = mg_get_http_header((http_message *)&hm,"Transfer-Encoding"),
        pmVar3 != (mg_str *)0x0)) && (iVar2 = mg_vcasecmp(pmVar3,"chunked"), iVar2 == 0)) {
      mg_handle_chunked(nc,(http_message *)&hm,mb->buf + iVar1,(nc->recv_mbuf).len - (long)iVar1);
    }
    if ((iVar1 < 0) || ((iVar1 == 0 && (0x1fff < (nc->recv_mbuf).len)))) {
      if (LL_DEBUG < s_cs_log_level) {
        fprintf(_stderr,"%-20s ","http_handler");
        cs_log_printf("invalid request");
      }
      nc->flags = nc->flags | 0x800;
    }
    else if (iVar1 != 0) {
      if ((nc->listener == (mg_connection *)0x0) &&
         (pmVar3 = mg_get_http_header((http_message *)&hm,"Sec-WebSocket-Accept"),
         pmVar3 != (mg_str *)0x0)) {
        mbuf_remove(mb,(long)iVar1);
        nc->proto_handler = websocket_handler;
        nc->flags = nc->flags | 0x80;
        mg_call(nc,nc->handler,0x70,(void *)0x0);
        websocket_handler(nc,3,(void *)shm.body.len);
      }
      else if ((nc->listener == (mg_connection *)0x0) ||
              (pmVar3 = mg_get_http_header((http_message *)&hm,"Sec-WebSocket-Key"),
              pmVar3 == (mg_str *)0x0)) {
        if (shm.message.p <= (char *)(nc->recv_mbuf).len) {
          iVar1 = 0x65;
          if (nc->listener != (mg_connection *)0x0) {
            iVar1 = 100;
          }
          mg_call(nc,nc->handler,iVar1,(http_message *)&hm);
          mbuf_remove(mb,(size_t)shm.message.p);
        }
      }
      else {
        mbuf_remove(mb,(long)iVar1);
        nc->proto_handler = websocket_handler;
        nc->flags = nc->flags | 0x80;
        mg_call(nc,nc->handler,0x6f,(http_message *)&hm);
        if ((nc->flags & 0x800) == 0) {
          if ((nc->send_mbuf).len == 0) {
            ws_handshake(nc,pmVar3);
          }
          mg_call(nc,nc->handler,0x70,(void *)0x0);
          websocket_handler(nc,3,(void *)shm.body.len);
        }
      }
    }
  }
  return;
}

Assistant:

void http_handler(struct mg_connection *nc, int ev, void *ev_data) {
    struct http_message shm;
    struct http_message *hm = &shm;
#endif
    struct mbuf *io = &nc->recv_mbuf;
    int req_len;
    const int is_req = (nc->listener != NULL);
#ifndef MG_DISABLE_HTTP_WEBSOCKET
    struct mg_str *vec;
#endif
    if (ev == MG_EV_CLOSE) {
        /*
     * For HTTP messages without Content-Length, always send HTTP message
     * before MG_EV_CLOSE message.
     */
        if (io->len > 0 && mg_parse_http(io->buf, io->len, hm, is_req) > 0) {
            int ev2 = is_req ? MG_EV_HTTP_REQUEST : MG_EV_HTTP_REPLY;
            hm->message.len = io->len;
            hm->body.len = io->buf + io->len - hm->body.p;
            mg_call(nc, nc->handler, ev2, hm);
        }
        free_http_proto_data(nc);
    }

    if (nc->proto_data != NULL) {
        transfer_file_data(nc);
    }

    mg_call(nc, nc->handler, ev, ev_data);

    if (ev == MG_EV_RECV) {
        struct mg_str *s;
        req_len = mg_parse_http(io->buf, io->len, hm, is_req);

        if (req_len > 0 &&
            (s = mg_get_http_header(hm, "Transfer-Encoding")) != NULL &&
            mg_vcasecmp(s, "chunked") == 0) {
            mg_handle_chunked(nc, hm, io->buf + req_len, io->len - req_len);
        }

        if (req_len < 0 || (req_len == 0 && io->len >= MG_MAX_HTTP_REQUEST_SIZE)) {
            DBG(("invalid request"));
            nc->flags |= MG_F_CLOSE_IMMEDIATELY;
        } else if (req_len == 0) {
            /* Do nothing, request is not yet fully buffered */
        }
#ifndef MG_DISABLE_HTTP_WEBSOCKET
        else if (nc->listener == NULL &&
                 mg_get_http_header(hm, "Sec-WebSocket-Accept")) {
            /* We're websocket client, got handshake response from server. */
            /* TODO(lsm): check the validity of accept Sec-WebSocket-Accept */
            mbuf_remove(io, req_len);
            nc->proto_handler = websocket_handler;
            nc->flags |= MG_F_IS_WEBSOCKET;
            mg_call(nc, nc->handler, MG_EV_WEBSOCKET_HANDSHAKE_DONE, NULL);
            websocket_handler(nc, MG_EV_RECV, ev_data);
        } else if (nc->listener != NULL &&
                   (vec = mg_get_http_header(hm, "Sec-WebSocket-Key")) != NULL) {
            /* This is a websocket request. Switch protocol handlers. */
            mbuf_remove(io, req_len);
            nc->proto_handler = websocket_handler;
            nc->flags |= MG_F_IS_WEBSOCKET;

            /* Send handshake */
            mg_call(nc, nc->handler, MG_EV_WEBSOCKET_HANDSHAKE_REQUEST, hm);
            if (!(nc->flags & MG_F_CLOSE_IMMEDIATELY)) {
                if (nc->send_mbuf.len == 0) {
                    ws_handshake(nc, vec);
                }
                mg_call(nc, nc->handler, MG_EV_WEBSOCKET_HANDSHAKE_DONE, NULL);
                websocket_handler(nc, MG_EV_RECV, ev_data);
            }
        }
#endif /* MG_DISABLE_HTTP_WEBSOCKET */
        else if (hm->message.len <= io->len) {
            int trigger_ev = nc->listener ? MG_EV_HTTP_REQUEST : MG_EV_HTTP_REPLY;

/* Whole HTTP message is fully buffered, call event handler */

#ifdef MG_ENABLE_JAVASCRIPT
                                                                                                                                    v7_val_t v1, v2, headers, req, args, res;
      struct v7 *v7 = nc->mgr->v7;
      const char *ev_name = trigger_ev == MG_EV_HTTP_REPLY ? "onsnd" : "onrcv";
      int i, js_callback_handled_request = 0;

      if (v7 != NULL) {
        /* Lookup JS callback */
        v1 = v7_get(v7, v7_get_global(v7), "Http", ~0);
        v2 = v7_get(v7, v1, ev_name, ~0);

        /* Create callback params. TODO(lsm): own/disown those */
        args = v7_create_array(v7);
        req = v7_create_object(v7);
        headers = v7_create_object(v7);

        /* Populate request object */
        v7_set(v7, req, "method", ~0, 0,
               v7_create_string(v7, hm->method.p, hm->method.len, 1));
        v7_set(v7, req, "uri", ~0, 0,
               v7_create_string(v7, hm->uri.p, hm->uri.len, 1));
        v7_set(v7, req, "body", ~0, 0,
               v7_create_string(v7, hm->body.p, hm->body.len, 1));
        v7_set(v7, req, "headers", ~0, 0, headers);
        for (i = 0; hm->header_names[i].len > 0; i++) {
          const struct mg_str *name = &hm->header_names[i];
          const struct mg_str *value = &hm->header_values[i];
          v7_set(v7, headers, name->p, name->len, 0,
                 v7_create_string(v7, value->p, value->len, 1));
        }

        /* Invoke callback. TODO(lsm): report errors */
        v7_array_push(v7, args, v7_create_foreign(nc));
        v7_array_push(v7, args, req);
        if (v7_apply(v7, v2, v7_create_undefined(), args, &res) == V7_OK &&
            v7_is_true(v7, res)) {
          js_callback_handled_request++;
        }
      }

      /* If JS callback returns true, stop request processing */
      if (js_callback_handled_request) {
        nc->flags |= MG_F_SEND_AND_CLOSE;
      } else {
        mg_call(nc, nc->handler, trigger_ev, hm);
      }
#else
            mg_call(nc, nc->handler, trigger_ev, hm);
#endif
            mbuf_remove(io, hm->message.len);
        }
    }
}